

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O0

void sfd_tran_accept_cb(void *arg)

{
  nng_stream *conn_00;
  nng_stream *conn;
  sfd_tran_pipe *psStack_28;
  int rv;
  sfd_tran_pipe *p;
  nni_aio *aio;
  sfd_tran_ep *ep;
  void *arg_local;
  
  p = (sfd_tran_pipe *)((long)arg + 0xd0);
  aio = (nni_aio *)arg;
  ep = (sfd_tran_ep *)arg;
  nni_mtx_lock((nni_mtx *)arg);
  conn._4_4_ = nni_aio_result((nni_aio *)p);
  if (conn._4_4_ == NNG_OK) {
    conn_00 = (nng_stream *)nni_aio_get_output((nni_aio *)p,0);
    if (((ulong)(aio->a_task).task_cb & 0x10000) == 0) {
      conn._4_4_ = nni_pipe_alloc_listener
                             (&stack0xffffffffffffffd8,(nni_listener *)aio[1].a_iov[5].iov_buf);
      if (conn._4_4_ == NNG_OK) {
        sfd_tran_pipe_start(psStack_28,conn_00,(sfd_tran_ep *)aio);
        nng_stream_listener_accept
                  ((nng_stream_listener *)aio[1].a_iov[5].iov_len,(nng_aio *)(aio->a_iov + 2));
        nni_mtx_unlock((nni_mtx *)aio);
        return;
      }
      nng_stream_free(conn_00);
    }
    else {
      nng_stream_free(conn_00);
      conn._4_4_ = NNG_ECLOSED;
    }
  }
  p = (sfd_tran_pipe *)aio->a_iov[1].iov_len;
  if (p != (sfd_tran_pipe *)0x0) {
    aio->a_iov[1].iov_len = 0;
    nni_aio_finish_error((nni_aio *)p,conn._4_4_);
  }
  if ((((ulong)(aio->a_task).task_cb & 0x10000) == 0) && (conn._4_4_ != NNG_ESTOPPED)) {
    nng_stream_listener_accept
              ((nng_stream_listener *)aio[1].a_iov[5].iov_len,(nng_aio *)(aio->a_iov + 2));
  }
  nni_mtx_unlock((nni_mtx *)aio);
  return;
}

Assistant:

static void
sfd_tran_accept_cb(void *arg)
{
	sfd_tran_ep   *ep  = arg;
	nni_aio       *aio = &ep->connaio;
	sfd_tran_pipe *p;
	int            rv;
	nng_stream    *conn;

	nni_mtx_lock(&ep->mtx);

	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	conn = nni_aio_get_output(aio, 0);
	if (ep->closed) {
		nng_stream_free(conn);
		rv = NNG_ECLOSED;
		goto error;
	}
	if ((rv = nni_pipe_alloc_listener((void **) &p, ep->nlistener)) != 0) {
		nng_stream_free(conn);
		goto error;
	}
	sfd_tran_pipe_start(p, conn, ep);
	nng_stream_listener_accept(ep->listener, &ep->connaio);
	nni_mtx_unlock(&ep->mtx);
	return;

error:
	// When an error here occurs, let's send a notice up to the consumer.
	// That way it can be reported properly.
	if ((aio = ep->useraio) != NULL) {
		ep->useraio = NULL;
		nni_aio_finish_error(aio, rv);
	}
	if (!ep->closed && rv != NNG_ESTOPPED) {
		nng_stream_listener_accept(ep->listener, &ep->connaio);
	}
	nni_mtx_unlock(&ep->mtx);
}